

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateChangePerfTestCases.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gls::StateChangePerformanceCase::iterate(StateChangePerformanceCase *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  int iVar3;
  deUint32 dVar4;
  MessageBuilder *pMVar5;
  pointer puVar6;
  undefined4 extraout_var;
  deUint64 dVar8;
  deUint64 dVar9;
  undefined4 extraout_var_00;
  pointer puVar10;
  ulong uVar11;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  undefined1 local_1b0 [384];
  long lVar7;
  
  puVar10 = (this->m_interleavedResults).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar6 = (this->m_interleavedResults).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((puVar10 == puVar6) &&
     (puVar6 = puVar10,
     (this->m_batchedResults).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
     _M_impl.super__Vector_impl_data._M_start ==
     (this->m_batchedResults).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
     _M_impl.super__Vector_impl_data._M_finish)) {
    pTVar2 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Draw call count: ");
    pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&this->m_callCount);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Per call triangle count: ");
    pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&this->m_triangleCount);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    puVar10 = (this->m_interleavedResults).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar6 = (this->m_interleavedResults).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  if ((int)((ulong)((long)puVar6 - (long)puVar10) >> 3) < this->m_iterationCount) {
    uVar11 = (long)(this->m_batchedResults).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_batchedResults).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if ((ulong)((long)puVar6 - (long)puVar10) <= uVar11) {
      this_00 = &this->m_interleavedResults;
      iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
      lVar7 = CONCAT44(extraout_var,iVar3);
      (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])(this,lVar7);
      (**(code **)(lVar7 + 0x648))();
      dVar4 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar4,"glFinish()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x247);
      dVar8 = deGetMicroseconds();
      (*(this->super_TestCase).super_TestNode._vptr_TestNode[6])(this,lVar7);
      (**(code **)(lVar7 + 0x648))();
      dVar9 = deGetMicroseconds();
      dVar4 = (**(code **)(lVar7 + 0x800))();
      iVar3 = 0x250;
      goto LAB_01512173;
    }
  }
  else {
    uVar11 = (long)(this->m_batchedResults).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_batchedResults).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
  }
  if (this->m_iterationCount <= (int)(uVar11 >> 3)) {
    logAndSetTestResult(this);
    return STOP;
  }
  this_00 = &this->m_batchedResults;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var_00,iVar3);
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])(this,lVar7);
  (**(code **)(lVar7 + 0x648))();
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glFinish()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                  ,0x25e);
  dVar8 = deGetMicroseconds();
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[7])(this,lVar7);
  (**(code **)(lVar7 + 0x648))();
  dVar9 = deGetMicroseconds();
  dVar4 = (**(code **)(lVar7 + 0x800))();
  iVar3 = 0x267;
LAB_01512173:
  glu::checkError(dVar4,"glFinish()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                  ,iVar3);
  local_1b0._0_8_ = dVar9 - dVar8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (this_00,(unsigned_long *)local_1b0);
  return CONTINUE;
}

Assistant:

tcu::TestCase::IterateResult StateChangePerformanceCase::iterate (void)
{
	if (m_interleavedResults.empty() && m_batchedResults.empty())
	{
		TestLog& log = m_testCtx.getLog();

		log << TestLog::Message << "Draw call count: " << m_callCount << TestLog::EndMessage;
		log << TestLog::Message << "Per call triangle count: " << m_triangleCount << TestLog::EndMessage;
	}

	// \note [mika] Interleave sampling to balance effects of powerstate etc.
	if ((int)m_interleavedResults.size() < m_iterationCount && m_batchedResults.size() >= m_interleavedResults.size())
	{
		const glw::Functions&	gl			= m_renderCtx.getFunctions();
		deUint64				resBeginUs	= 0;
		deUint64				resEndUs	= 0;

		setupInitialState(gl);
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFinish()");

		// Render result
		resBeginUs = deGetMicroseconds();

		renderTest(gl);

		gl.finish();
		resEndUs = deGetMicroseconds();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFinish()");

		m_interleavedResults.push_back(resEndUs - resBeginUs);

		return CONTINUE;
	}
	else if ((int)m_batchedResults.size() < m_iterationCount)
	{
		const glw::Functions&	gl			= m_renderCtx.getFunctions();
		deUint64				refBeginUs	= 0;
		deUint64				refEndUs	= 0;

		setupInitialState(gl);
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFinish()");

		// Render reference
		refBeginUs = deGetMicroseconds();

		renderReference(gl);

		gl.finish();
		refEndUs = deGetMicroseconds();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFinish()");

		m_batchedResults.push_back(refEndUs - refBeginUs);

		return CONTINUE;
	}
	else
	{
		logAndSetTestResult();
		return STOP;
	}
}